

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

void yang_type_free(ly_ctx *ctx,lys_type *type)

{
  lys_tpdf *__ptr;
  uint uVar1;
  LY_DATA_TYPE LVar2;
  long lVar3;
  long lVar4;
  
  __ptr = type->der;
  if (__ptr == (lys_tpdf *)0x0) {
    return;
  }
  uVar1 = type->base + LY_TYPE_BINARY;
  if ((0xc < uVar1) || ((0x1003U >> (uVar1 & 0x1f) & 1) == 0)) goto LAB_00150ae9;
  lydict_remove(ctx,__ptr->dsc);
  LVar2 = *(LY_DATA_TYPE *)((long)&__ptr->name + 4);
  if (LVar2 == LY_TYPE_IDENT) {
    LVar2 = LY_TYPE_IDENT;
    if ((((ulong)__ptr->name & 0x20) == 0) && (0 < (type->info).bits.count)) {
      lVar3 = 0;
      do {
        free((&((type->info).bits.bit)->name)[lVar3]);
        lVar3 = lVar3 + 1;
      } while (lVar3 < (type->info).bits.count);
      LVar2 = *(LY_DATA_TYPE *)((long)&__ptr->name + 4);
      goto LAB_00150a9b;
    }
  }
  else {
LAB_00150a9b:
    if (LVar2 == LY_TYPE_UNION) {
      if (0 < (type->info).bits.count) {
        lVar3 = 0;
        lVar4 = 0;
        do {
          yang_type_free(ctx,(lys_type *)((long)&((type->info).bits.bit)->name + lVar3));
          lVar4 = lVar4 + 1;
          lVar3 = lVar3 + 0x40;
        } while (lVar4 < (type->info).bits.count);
      }
      free((type->info).bits.bit);
      LVar2 = LY_TYPE_DER;
    }
  }
  type->base = LVar2;
  free(__ptr);
  type->der = (lys_tpdf *)0x0;
LAB_00150ae9:
  lys_type_free(ctx,type);
  type->base = LY_TYPE_DER;
  type->ext_size = '\0';
  type->ext = (lys_ext_instance **)0x0;
  return;
}

Assistant:

void
yang_type_free(struct ly_ctx *ctx, struct lys_type *type)
{
    struct yang_type *stype = (struct yang_type *)type->der;
    int i;

    if (!stype) {
        return ;
    }
    if (type->base == LY_TYPE_DER || type->base == LY_TYPE_ERR || type->base == LY_TYPE_UNION) {
        lydict_remove(ctx, stype->name);
        if (stype->base == LY_TYPE_IDENT && (!(stype->flags & LYS_NO_ERASE_IDENTITY))) {
            for (i = 0; i < type->info.ident.count; ++i) {
                free(type->info.ident.ref[i]);
            }
        }
        if (stype->base == LY_TYPE_UNION) {
            for (i = 0; i < type->info.uni.count; ++i) {
                yang_type_free(ctx, &type->info.uni.types[i]);
            }
            free(type->info.uni.types);
            type->base = LY_TYPE_DER;
        } else {
            type->base = stype->base;
        }
        free(stype);
        type->der = NULL;
    }
    lys_type_free(ctx, type);
    type->base = LY_TYPE_DER;
    type->ext_size = 0;
    type->ext = NULL;
}